

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

void mbedtls_ssl_write_version
               (uchar *version,int transport,mbedtls_ssl_protocol_version tls_version)

{
  short sVar1;
  ushort local_1a;
  uint16_t tls_version_formatted;
  mbedtls_ssl_protocol_version tls_version_local;
  int transport_local;
  uchar *version_local;
  
  local_1a = (ushort)tls_version;
  if (transport == 1) {
    sVar1 = 0x201;
    if (tls_version == 0x302) {
      sVar1 = 0x202;
    }
    local_1a = local_1a - sVar1 ^ 0xffff;
  }
  mbedtls_put_unaligned_uint16(version,local_1a << 8 | local_1a >> 8);
  return;
}

Assistant:

void mbedtls_ssl_write_version(unsigned char version[2], int transport,
                               mbedtls_ssl_protocol_version tls_version)
{
    uint16_t tls_version_formatted;
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        tls_version_formatted =
            ~(tls_version - (tls_version == 0x0302 ? 0x0202 : 0x0201));
    } else
#else
    ((void) transport);
#endif
    {
        tls_version_formatted = (uint16_t) tls_version;
    }
    MBEDTLS_PUT_UINT16_BE(tls_version_formatted, version, 0);
}